

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *cm;
  cmGlobalGenerator *gg;
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  cmFileMonitor *pcVar4;
  Value *pVVar5;
  char *pcVar6;
  size_t sVar7;
  ValueHolder VVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_iterator cVar9;
  Value passedArgs;
  string sourceDir;
  string errorMessage;
  string buildDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [32];
  ValueHolder local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  ValueHolder local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  undefined1 local_f8 [24];
  char local_e0 [16];
  long local_d0 [2];
  cmServerResponse local_c0;
  
  if (this->m_State == STATE_INACTIVE) {
    local_198.string_ = local_1b8 + 0x30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_1b8 + 0x20),"This instance is inactive.","");
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)(local_1b8 + 0x20));
    VVar8 = local_198;
    if (local_198 == local_1b8 + 0x30) {
      return __return_storage_ptr__;
    }
    goto LAB_0025af4c;
  }
  pcVar4 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
  cmFileMonitor::StopMonitoring(pcVar4);
  local_150.string_ = local_148._M_local_buf + 8;
  local_148._M_allocated_capacity = 0;
  local_148._M_local_buf[8] = '\0';
  cm = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
       super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
       super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
       super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  GeneratorInformation::SetupGenerator(&this->GeneratorInfo,cm,(string *)&local_150);
  if (local_148._M_allocated_capacity == 0) {
    local_198.string_ = local_1b8 + 0x30;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_1b8 + 0x20),"unused","");
    __l._M_len = 1;
    __l._M_array = (iterator)(local_1b8 + 0x20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110,__l,(allocator_type *)local_1c8);
    if (local_198 != local_1b8 + 0x30) {
      operator_delete(local_198.string_,local_188._M_allocated_capacity + 1);
    }
    pVVar5 = Json::Value::operator[](&request->Data,&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
    Json::Value::Value((Value *)(local_1b8 + 0x20),pVVar5);
    bVar2 = Json::Value::isNull((Value *)(local_1b8 + 0x20));
    if (!bVar2) {
      bVar2 = Json::Value::isString((Value *)(local_1b8 + 0x20));
      if (bVar2) {
        Json::Value::asString_abi_cxx11_((string *)local_1c8,(Value *)(local_1b8 + 0x20));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
        if ((cmServerProtocol1 *)local_1c8._0_8_ != (cmServerProtocol1 *)local_1b8) {
LAB_0025aa4f:
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
        }
      }
      else {
        bVar2 = Json::Value::isArray((Value *)(local_1b8 + 0x20));
        if (bVar2) {
          cVar9 = Json::Value::begin((Value *)(local_1b8 + 0x20));
          local_170._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
          local_170[8] = cVar9.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar9 = Json::Value::end((Value *)(local_1b8 + 0x20));
            local_1c8._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
            local_1c8[8] = cVar9.super_ValueIteratorBase.isNull_;
            bVar2 = Json::ValueIteratorBase::isEqual
                              ((ValueIteratorBase *)local_170,(SelfType *)local_1c8);
            if (bVar2) break;
            pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_170);
            bVar2 = Json::Value::isString(pVVar5);
            if (!bVar2) goto LAB_0025a9a1;
            pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_170);
            Json::Value::asString_abi_cxx11_((string *)local_1c8,pVVar5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8);
            if ((cmServerProtocol1 *)local_1c8._0_8_ != (cmServerProtocol1 *)local_1b8) {
              operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_170);
          }
        }
        else {
LAB_0025a9a1:
          local_1c8._0_8_ = (cmServerProtocol1 *)local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,
                     "cacheArguments must be unset, a string or an array of strings.","");
          cmServerRequest::ReportError(&local_c0,request,(string *)local_1c8);
          Json::Value::~Value(&local_c0.m_Data);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.m_ErrorMessage._M_dataplus._M_p != &local_c0.m_ErrorMessage.field_2) {
            operator_delete(local_c0.m_ErrorMessage._M_dataplus._M_p,
                            local_c0.m_ErrorMessage.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.Cookie._M_dataplus._M_p != &local_c0.Cookie.field_2) {
            operator_delete(local_c0.Cookie._M_dataplus._M_p,
                            local_c0.Cookie.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0.Type._M_dataplus._M_p != &local_c0.Type.field_2) {
            operator_delete(local_c0.Type._M_dataplus._M_p,
                            local_c0.Type.field_2._M_allocated_capacity + 1);
          }
          if ((cmServerProtocol1 *)local_1c8._0_8_ != (cmServerProtocol1 *)local_1b8)
          goto LAB_0025aa4f;
        }
      }
    }
    pcVar6 = cmake::GetHomeDirectory(cm);
    std::__cxx11::string::string((string *)local_170,pcVar6,(allocator *)local_1c8);
    pcVar6 = cmake::GetHomeOutputDirectory(cm);
    std::__cxx11::string::string((string *)local_130,pcVar6,(allocator *)local_1c8);
    if (local_130._8_8_ == 0) {
      local_1c8._0_8_ = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"No build directory set via Handshake.","");
      cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
LAB_0025aec9:
      if ((cmServerProtocol1 *)local_1c8._0_8_ != (cmServerProtocol1 *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
      }
    }
    else {
      gg = cm->GlobalGenerator;
      bVar2 = cmake::LoadCache(cm,(string *)local_130);
      if (!bVar2) {
        if (CONCAT71(local_170._9_7_,local_170[8]) != 0) goto LAB_0025ad05;
        local_1c8._0_8_ = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,
                   "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                   ,"");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
        goto LAB_0025aec9;
      }
      pcVar1 = cm->State;
      local_1c8._0_8_ = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_HOME_DIRECTORY","")
      ;
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_1c8);
      if ((_Base_ptr)local_1c8._0_8_ != (_Base_ptr)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
      }
      if (pcVar6 == (char *)0x0) {
        local_1c8._0_8_ = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"No CMAKE_HOME_DIRECTORY found in cache.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
        goto LAB_0025aec9;
      }
      if (CONCAT71(local_170._9_7_,local_170[8]) == 0) {
        local_1c8._0_8_ = local_1b8;
        sVar7 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,pcVar6,pcVar6 + sVar7);
        std::__cxx11::string::operator=((string *)local_170,(string *)local_1c8);
        if ((_Base_ptr)local_1c8._0_8_ != (_Base_ptr)local_1b8) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
        }
        cmake::SetHomeDirectory(cm,(string *)local_170);
      }
      pcVar1 = cm->State;
      local_1c8._0_8_ = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_GENERATOR","");
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,(string *)local_1c8);
      if ((cmServerProtocol1 *)local_1c8._0_8_ != (cmServerProtocol1 *)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
      }
      if (pcVar6 != (char *)0x0) {
        if (gg == (cmGlobalGenerator *)0x0) {
          bVar2 = false;
        }
        else {
          (*gg->_vptr_cmGlobalGenerator[3])(local_e0,gg);
          iVar3 = std::__cxx11::string::compare(local_e0);
          bVar2 = iVar3 != 0;
          if ((long *)local_e0._0_8_ != local_d0) {
            operator_delete((void *)local_e0._0_8_,local_d0[0] + 1);
          }
        }
        if (bVar2) {
          local_1c8._0_8_ = local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,
                     "Configured generator does not match with CMAKE_GENERATOR found in cache.","");
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
          goto LAB_0025aec9;
        }
      }
LAB_0025ad05:
      cmSystemTools::s_FatalErrorOccured = false;
      cmSystemTools::s_ErrorOccured = false;
      iVar3 = cmake::AddCMakePaths(cm);
      if (iVar3 != 1) {
        local_1c8._0_8_ = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Failed to set CMake paths.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
        goto LAB_0025aec9;
      }
      bVar2 = cmake::SetCacheArgs(cm,&local_110);
      if (!bVar2) {
        local_1c8._0_8_ = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"cacheArguments could not be set.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
        goto LAB_0025aec9;
      }
      iVar3 = cmake::Configure(cm);
      if (iVar3 < 0) {
        local_1c8._0_8_ = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Configuration failed.","");
        cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)local_1c8);
        goto LAB_0025aec9;
      }
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_f8._16_8_ = 0;
      local_1c8._8_8_ = 0;
      local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffffffffff00;
      local_1c8._0_8_ = (_Base_ptr)local_1b8;
      anon_unknown.dwarf_63634::getCMakeInputs
                (gg,(string *)local_1c8,(string *)local_130,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      if ((_Base_ptr)local_1c8._0_8_ != (_Base_ptr)local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
      }
      pcVar4 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
      local_1c8._8_8_ = 0;
      local_1b8._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1101:31)>
           ::_M_invoke;
      local_1b8._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx:1101:31)>
           ::_M_manager;
      local_1c8._0_8_ = this;
      cmFileMonitor::MonitorPaths
                (pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_f8,(Callback *)local_1c8);
      if ((code *)local_1b8._0_8_ != (code *)0x0) {
        (*(code *)local_1b8._0_8_)(local_1c8,local_1c8,3);
      }
      this->m_State = STATE_CONFIGURED;
      this->m_isDirty = false;
      Json::Value::Value((Value *)local_1c8,nullValue);
      cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)local_1c8);
      Json::Value::~Value((Value *)local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._0_8_ != &local_120) {
      operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._0_8_ != &local_160) {
      operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
    }
    Json::Value::~Value((Value *)(local_1b8 + 0x20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
  }
  else {
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_150);
  }
  if (local_150 == local_148._M_local_buf + 8) {
    return __return_storage_ptr__;
  }
  local_188._M_allocated_capacity = CONCAT71(local_148._9_7_,local_148._M_local_buf[8]);
  VVar8 = local_150;
LAB_0025af4c:
  operator_delete(VVar8.string_,local_188._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto i = passedArgs.begin(); i != passedArgs.end(); ++i) {
        if (!i->isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(i->asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const char* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = std::string(cachedSourceDir);
      cm->SetHomeDirectory(sourceDir);
    }

    const char* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  getCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList, nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}